

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,char *str,char *str_end)

{
  ImGuiID IVar1;
  uint *puVar2;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  ImGuiContext *g;
  ImGuiID id;
  ImGuiID seed;
  void *in_stack_00000060;
  void *in_stack_00000068;
  ImGuiDataType in_stack_00000070;
  ImGuiID in_stack_00000074;
  size_t local_38;
  
  puVar2 = ImVector<unsigned_int>::back((ImVector<unsigned_int> *)(in_RDI + 0xd0));
  if (in_RDX == 0) {
    local_38 = 0;
  }
  else {
    local_38 = in_RDX - (long)in_RSI;
  }
  IVar1 = ImHashStr(in_RSI,local_38,*puVar2);
  if (GImGui->DebugHookIdInfo == IVar1) {
    ImGui::DebugHookIdInfo(in_stack_00000074,in_stack_00000070,in_stack_00000068,in_stack_00000060);
  }
  return IVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetID(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_String, str, str_end);
    return id;
}